

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Opnd * __thiscall IR::Instr::UnlinkDst(Instr *this)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  RegOpnd *pRVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  
  this_00 = this->m_dst;
  bVar2 = Opnd::IsRegOpnd(this_00);
  if (bVar2) {
    pRVar3 = Opnd::AsRegOpnd(this_00);
    pSVar6 = pRVar3->m_sym;
  }
  else {
    bVar2 = Opnd::IsSymOpnd(this_00);
    if (!bVar2) goto LAB_0047edce;
    pSVar5 = Opnd::AsSymOpnd(this_00);
    if (pSVar5->m_sym->m_kind != SymKindStack) goto LAB_0047edce;
    pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  }
  if ((pSVar6 != (StackSym *)0x0) && ((pSVar6->field_0x18 & 1) != 0)) {
    if ((pSVar6->field_5).m_instrDef == this) {
      (pSVar6->field_5).m_instrDef = (Instr *)0x0;
    }
    else if (-1 < (char)this_00->field_0xb) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x8fe,"(oldDst->isFakeDst)","oldDst->isFakeDst");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
LAB_0047edce:
  if ((char)this_00->field_0xb < '\0') {
    this_00->field_0xb = this_00->field_0xb & 0x7f;
  }
  Opnd::UnUse(this_00);
  this->m_dst = (Opnd *)0x0;
  return this_00;
}

Assistant:

Opnd *
Instr::UnlinkDst()
{
    Opnd * oldDst = this->m_dst;
    StackSym *stackSym = nullptr;

    // If oldDst isSingleDef, clear instrDef

    if (oldDst->IsRegOpnd())
    {
        stackSym = oldDst->AsRegOpnd()->m_sym;
    }
    else if (oldDst->IsSymOpnd())
    {
        Sym *sym = oldDst->AsSymOpnd()->m_sym;
        if (sym->IsStackSym())
        {
            stackSym = sym->AsStackSym();
        }
    }

    if (stackSym && stackSym->m_isSingleDef)
    {
        if (stackSym->m_instrDef == this)
        {
            stackSym->m_instrDef = nullptr;
        }
        else
        {
            Assert(oldDst->isFakeDst);
        }
    }
#if DBG
    if (oldDst->isFakeDst)
    {
        oldDst->isFakeDst = false;
    }
#endif

    oldDst->UnUse();
    this->m_dst = nullptr;

    return oldDst;
}